

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flagser.h
# Opt level: O1

filtered_directed_graph_t *
read_graph_flagser(filtered_directed_graph_t *__return_storage_ptr__,string *filename,
                  flagser_parameters *params)

{
  float fVar1;
  float fVar2;
  float fVar3;
  pointer pcVar4;
  filtered_directed_graph_t *pfVar5;
  pointer pfVar6;
  pointer pfVar7;
  char cVar8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var9;
  long *plVar10;
  ulong uVar11;
  runtime_error *this;
  size_type *psVar12;
  pointer **pppuVar13;
  size_type sVar14;
  byte bVar15;
  int iVar16;
  float fVar17;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vertices;
  string line;
  vector<float,_std::allocator<float>_> vertices_1;
  string err_msg;
  ifstream input_stream;
  filtered_directed_graph_t *local_5d8;
  uint local_5cc;
  vector<float,_std::allocator<float>_> local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  string local_580;
  vector<float,_std::allocator<float>_> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  filtered_directed_graph_t local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  vector<float,_std::allocator<float>_> *local_3e8;
  pointer **local_3e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_3d8;
  pointer **local_3d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_3c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_3c0;
  vector<float,_std::allocator<float>_> *local_3b8;
  vector<float,_std::allocator<float>_> *local_3b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_3a8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_3a0;
  flagser_parameters *local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  string local_370;
  vector<float,_std::allocator<float>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  long local_238 [4];
  byte abStack_218 [488];
  
  local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
  local_580._M_string_length = 0;
  local_580.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->super_directed_graph_t).indegrees.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).indegrees.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).outdegrees.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).indegrees.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).outdegrees.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).outdegrees.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).edge_filtration.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).edge_filtration.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).edges.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).edge_filtration.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).edges.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).edges.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).directed = true;
  (__return_storage_ptr__->super_directed_graph_t).incidence_incoming.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).incidence_incoming.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).incidence_incoming.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).incidence_outgoing.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).incidence_outgoing.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).incidence_outgoing.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->edge_filtration).super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->edge_filtration).super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->edge_filtration).super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_5c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_5c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_398 = params;
  std::ifstream::ifstream(local_238);
  pcVar4 = (filename->_M_dataplus)._M_p;
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_370,pcVar4,pcVar4 + filename->_M_string_length);
  open_file(&local_370,(ifstream *)local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
  }
  local_3a0 = &(__return_storage_ptr__->super_directed_graph_t).edges;
  local_3a8 = &(__return_storage_ptr__->super_directed_graph_t).incidence_incoming;
  local_3b0 = &__return_storage_ptr__->vertex_filtration;
  local_3b8 = &(__return_storage_ptr__->super_directed_graph_t).edge_filtration;
  local_3c0 = &(__return_storage_ptr__->super_directed_graph_t).outdegrees;
  local_3c8 = &(__return_storage_ptr__->super_directed_graph_t).indegrees;
  local_3d8 = &(__return_storage_ptr__->super_directed_graph_t).incidence_outgoing;
  local_3d0 = (pointer **)&local_528.super_directed_graph_t.incidence_outgoing;
  local_3e8 = &__return_storage_ptr__->edge_filtration;
  local_3e0 = (pointer **)&local_528.edge_filtration;
  bVar15 = 0;
  local_5cc = (uint)CONCAT71((int7)((ulong)&local_528.edge_filtration >> 8),1);
  local_5d8 = __return_storage_ptr__;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          do {
            if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) != 0) {
              std::ifstream::~ifstream(local_238);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_5c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_5c8.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_5c8.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              pfVar5 = local_5d8;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_580._M_dataplus._M_p != &local_580.field_2) {
                operator_delete(local_580._M_dataplus._M_p,
                                CONCAT71(local_580.field_2._M_allocated_capacity._1_7_,
                                         local_580.field_2._M_local_buf[0]) + 1);
              }
              return pfVar5;
            }
            cVar8 = std::ios::widen((char)&local_5d8 + (char)*(long *)(local_238[0] + -0x18) + -0x60
                                   );
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_238,(string *)&local_580,cVar8);
            _Var9 = std::
                    __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_negate<trim(std::__cxx11::string_const&)::_lambda(int)_1_>>
                              (local_580._M_dataplus._M_p,
                               local_580._M_dataplus._M_p + local_580._M_string_length);
            local_5a8._M_dataplus._M_p = local_580._M_dataplus._M_p + local_580._M_string_length;
            local_548._M_dataplus._M_p = local_580._M_dataplus._M_p;
            std::
            __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_negate<trim(std::__cxx11::string_const&)::_lambda(int)_2_>>
                      (&local_390,&local_5a8,&local_548);
            local_528.super_directed_graph_t._0_8_ =
                 &local_528.super_directed_graph_t.edges.
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_finish;
            if (_Var9._M_current < local_390._M_dataplus._M_p) {
              std::__cxx11::string::
              _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        ((string *)&local_528,_Var9._M_current);
            }
            else {
              local_528.super_directed_graph_t.edges.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_528.super_directed_graph_t.edges.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)((ulong)local_528.super_directed_graph_t.edges.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00)
              ;
            }
            std::__cxx11::string::operator=((string *)&local_580,(string *)&local_528);
            if ((pointer *)local_528.super_directed_graph_t._0_8_ !=
                &local_528.super_directed_graph_t.edges.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_finish) {
              operator_delete((void *)local_528.super_directed_graph_t._0_8_,
                              (ulong)((long)local_528.super_directed_graph_t.edges.
                                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                            ._M_impl.super__Vector_impl_data._M_finish + 1));
            }
          } while (local_580._M_string_length == 0);
          if (((*local_580._M_dataplus._M_p != 'd') || (local_580._M_dataplus._M_p[1] != 'i')) ||
             (local_580._M_dataplus._M_p[2] != 'm')) break;
          if (local_580._M_dataplus._M_p[4] == '1') {
            std::vector<float,_std::allocator<float>_>::vector(&local_350,&local_5c8);
            filtered_directed_graph_t::filtered_directed_graph_t
                      (&local_528,&local_350,local_398->directed);
            pfVar5 = local_5d8;
            (local_5d8->super_directed_graph_t).number_of_vertices =
                 local_528.super_directed_graph_t.number_of_vertices;
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::_M_move_assign
                      (local_3a0,&local_528.super_directed_graph_t.edges);
            std::vector<float,_std::allocator<float>_>::_M_move_assign
                      (local_3b8,&local_528.super_directed_graph_t.edge_filtration);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                      (local_3c0,&local_528.super_directed_graph_t.outdegrees);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                      (local_3c8,&local_528.super_directed_graph_t.indegrees);
            (pfVar5->super_directed_graph_t).directed = local_528.super_directed_graph_t.directed;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                      (local_3a8,&local_528.super_directed_graph_t.incidence_incoming);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                      (local_3d8,local_3d0);
            (pfVar5->super_directed_graph_t).incidence_row_length =
                 local_528.super_directed_graph_t.incidence_row_length;
            std::vector<float,_std::allocator<float>_>::_M_move_assign
                      (local_3b0,&local_528.vertex_filtration);
            std::vector<float,_std::allocator<float>_>::_M_move_assign(local_3e8,local_3e0);
            if (local_528.edge_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_528.edge_filtration.
                              super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_528.edge_filtration.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_528.edge_filtration.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            if (local_528.vertex_filtration.super__Vector_base<float,_std::allocator<float>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_528.vertex_filtration.
                              super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_528.vertex_filtration.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_528.vertex_filtration.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            if (local_528.super_directed_graph_t.incidence_outgoing.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_528.super_directed_graph_t.incidence_outgoing.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_528.super_directed_graph_t.incidence_outgoing.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_528.super_directed_graph_t.incidence_outgoing.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_528.super_directed_graph_t.incidence_incoming.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_528.super_directed_graph_t.incidence_incoming.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_528.super_directed_graph_t.incidence_incoming.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_528.super_directed_graph_t.incidence_incoming.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_528.super_directed_graph_t.indegrees.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_528.super_directed_graph_t.indegrees.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_528.super_directed_graph_t.indegrees.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_528.super_directed_graph_t.indegrees.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_528.super_directed_graph_t.outdegrees.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_528.super_directed_graph_t.outdegrees.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_528.super_directed_graph_t.outdegrees.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_528.super_directed_graph_t.outdegrees.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_528.super_directed_graph_t.edge_filtration.
                super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_start != (pointer)0x0) {
              operator_delete(local_528.super_directed_graph_t.edge_filtration.
                              super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_528.super_directed_graph_t.edge_filtration.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_528.super_directed_graph_t.edge_filtration.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            if (local_528.super_directed_graph_t.edges.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_528.super_directed_graph_t.edges.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_528.super_directed_graph_t.edges.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_528.super_directed_graph_t.edges.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_350.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_350.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_350.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_350.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            bVar15 = 1;
            local_5cc = 0;
          }
        }
        if ((local_5cc & 1) == 0) break;
        if (local_5c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_5c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_528.super_directed_graph_t.edges.
          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_528.super_directed_graph_t._0_8_ = string_to_float;
          local_528.super_directed_graph_t.edges.
          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)std::
                        _Function_handler<float_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_float_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        ::_M_invoke;
          local_528.super_directed_graph_t.edges.
          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)std::
                        _Function_handler<float_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_float_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        ::_M_manager;
          split<float>((vector<float,_std::allocator<float>_> *)&local_5a8,&local_580,' ',
                       (function<float_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        *)&local_528);
          pfVar7 = local_5c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          pfVar6 = local_5c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_5c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_5a8._M_dataplus._M_p;
          local_5c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_5a8._M_string_length;
          local_5c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)local_5a8.field_2._M_allocated_capacity;
          local_5a8._M_dataplus._M_p = (pointer)0x0;
          local_5a8._M_string_length = 0;
          local_5a8.field_2._M_allocated_capacity = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pfVar6 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(pfVar6,(long)pfVar7 - (long)pfVar6);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5a8._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_5a8._M_dataplus._M_p,
                            local_5a8.field_2._M_allocated_capacity -
                            (long)local_5a8._M_dataplus._M_p);
          }
          if ((code *)local_528.super_directed_graph_t.edges.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_finish != (code *)0x0) {
            (*(code *)local_528.super_directed_graph_t.edges.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_finish)(&local_528,&local_528,3);
          }
        }
      }
      if (bVar15 == 1) {
        sVar14 = 0;
        iVar16 = 0;
        do {
          iVar16 = iVar16 + (uint)(local_580._M_dataplus._M_p[sVar14] == ' ');
          sVar14 = sVar14 + 1;
        } while (local_580._M_string_length != sVar14);
        bVar15 = iVar16 == 1 | 2;
      }
      if (bVar15 != 3) break;
      local_528.super_directed_graph_t.edges.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_528.super_directed_graph_t._0_8_ = string_to_uint;
      local_528.super_directed_graph_t.edges.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    _Function_handler<unsigned_short_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_unsigned_int_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                    ::_M_invoke;
      local_528.super_directed_graph_t.edges.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)std::
                    _Function_handler<unsigned_short_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_unsigned_int_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                    ::_M_manager;
      split<unsigned_short>
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_5a8,&local_580,
                 ' ',(function<unsigned_short_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                      *)&local_528);
      if ((code *)local_528.super_directed_graph_t.edges.
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_finish != (code *)0x0) {
        (*(code *)local_528.super_directed_graph_t.edges.
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_finish)(&local_528,&local_528,3);
      }
      directed_graph_t::add_edge
                (&local_5d8->super_directed_graph_t,*(vertex_index_t *)local_5a8._M_dataplus._M_p,
                 *(vertex_index_t *)(local_5a8._M_dataplus._M_p + 2));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_5a8._M_dataplus._M_p,
                        local_5a8.field_2._M_allocated_capacity - (long)local_5a8._M_dataplus._M_p);
      }
      bVar15 = 3;
    }
    local_528.super_directed_graph_t.edges.
    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_528.super_directed_graph_t._0_8_ = string_to_float;
    local_528.super_directed_graph_t.edges.
    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  _Function_handler<float_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_float_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                  ::_M_invoke;
    local_528.super_directed_graph_t.edges.
    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)std::
                  _Function_handler<float_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_float_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                  ::_M_manager;
    split<float>(&local_560,&local_580,' ',
                 (function<float_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                  *)&local_528);
    if ((code *)local_528.super_directed_graph_t.edges.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_finish != (code *)0x0) {
      (*(code *)local_528.super_directed_graph_t.edges.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_finish)(&local_528,&local_528,3);
    }
    fVar1 = *local_560.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    fVar2 = local_560.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[1];
    fVar17 = *(float *)((long)local_5c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start +
                       ((long)fVar2 >> 0x3f & (long)(fVar2 - 9.223372e+18) | (long)fVar2) * 4);
    fVar3 = *(float *)((long)local_5c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start +
                      ((long)fVar1 >> 0x3f & (long)(fVar1 - 9.223372e+18) | (long)fVar1) * 4);
    if (fVar17 <= fVar3) {
      fVar17 = fVar3;
    }
    if (local_560.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[2] < fVar17) break;
    filtered_directed_graph_t::add_filtered_edge
              (local_5d8,(vertex_index_t)(int)fVar1,(vertex_index_t)(int)fVar2,
               local_560.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[2]);
    if (local_560.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (float *)0x0) {
      operator_delete(local_560.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_560.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_560.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_2b8,vsnprintf,0x3a,"%f",
             SUB84((double)*local_560.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,0));
  std::operator+(&local_298,
                 "The flagser file contained an edge filtration that contradicts the vertex filtration, the edge ("
                 ,&local_2b8);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_298);
  local_448._M_dataplus._M_p = (pointer)*plVar10;
  psVar12 = (size_type *)(plVar10 + 2);
  if ((size_type *)local_448._M_dataplus._M_p == psVar12) {
    local_448.field_2._M_allocated_capacity = *psVar12;
    local_448.field_2._8_8_ = plVar10[3];
    local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  }
  else {
    local_448.field_2._M_allocated_capacity = *psVar12;
  }
  local_448._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_2d8,vsnprintf,0x3a,"%f",
             SUB84((double)local_560.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start[1],0));
  std::operator+(&local_278,&local_448,&local_2d8);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_278);
  local_428._M_dataplus._M_p = (pointer)*plVar10;
  psVar12 = (size_type *)(plVar10 + 2);
  if ((size_type *)local_428._M_dataplus._M_p == psVar12) {
    local_428.field_2._M_allocated_capacity = *psVar12;
    local_428.field_2._8_8_ = plVar10[3];
    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  }
  else {
    local_428.field_2._M_allocated_capacity = *psVar12;
  }
  local_428._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_2f8,vsnprintf,0x3a,"%f",
             SUB84((double)local_560.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start[2],0));
  std::operator+(&local_258,&local_428,&local_2f8);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_258);
  local_408._M_dataplus._M_p = (pointer)*plVar10;
  psVar12 = (size_type *)(plVar10 + 2);
  if ((size_type *)local_408._M_dataplus._M_p == psVar12) {
    local_408.field_2._M_allocated_capacity = *psVar12;
    local_408.field_2._8_8_ = plVar10[3];
    local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  }
  else {
    local_408.field_2._M_allocated_capacity = *psVar12;
  }
  local_408._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  uVar11 = (ulong)*local_560.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_318,vsnprintf,0x3a,"%f",
             SUB84((double)*(float *)((long)local_5c8.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_start +
                                     ((long)(*local_560.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start -
                                            9.223372e+18) & (long)uVar11 >> 0x3f | uVar11) * 4),0));
  std::operator+(&local_390,&local_408,&local_318);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_390);
  local_548._M_dataplus._M_p = (pointer)*plVar10;
  psVar12 = (size_type *)(plVar10 + 2);
  if ((size_type *)local_548._M_dataplus._M_p == psVar12) {
    local_548.field_2._M_allocated_capacity = *psVar12;
    local_548.field_2._8_8_ = plVar10[3];
    local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
  }
  else {
    local_548.field_2._M_allocated_capacity = *psVar12;
  }
  local_548._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  uVar11 = (ulong)local_560.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start[1];
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_338,vsnprintf,0x3a,"%f",
             SUB84((double)*(float *)((long)local_5c8.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_start +
                                     ((long)(local_560.
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data._M_start[1] -
                                            9.223372e+18) & (long)uVar11 >> 0x3f | uVar11) * 4),0));
  std::operator+(&local_5a8,&local_548,&local_338);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_5a8);
  local_528.super_directed_graph_t._0_8_ = *plVar10;
  pppuVar13 = (pointer **)(plVar10 + 2);
  if ((pointer **)local_528.super_directed_graph_t._0_8_ == pppuVar13) {
    local_528.super_directed_graph_t.edges.
    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)*pppuVar13;
    local_528.super_directed_graph_t.edges.
    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)plVar10[3];
    local_528.super_directed_graph_t._0_8_ =
         &local_528.super_directed_graph_t.edges.
          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish;
  }
  else {
    local_528.super_directed_graph_t.edges.
    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)*pppuVar13;
  }
  local_528.super_directed_graph_t.edges.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)plVar10[1];
  *plVar10 = (long)pppuVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
    operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p != &local_548.field_2) {
    operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,(string *)&local_528);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

filtered_directed_graph_t read_graph_flagser(const std::string filename, const flagser_parameters& params) {
	std::string line;
	filtered_directed_graph_t graph{};
	int current_dimension = 0;
	std::vector<value_t> vertex_filtration;
	HAS_EDGE_FILTRATION has_edge_filtration = HAS_EDGE_FILTRATION::TOO_EARLY_TO_DECIDE;

	std::ifstream input_stream;
	open_file(filename, input_stream);

	while (not input_stream.eof()) {
		getline(input_stream, line);
		line = trim(line);
		if (line.length() == 0) continue;
		if (line[0] == 'd' && line[1] == 'i' && line[2] == 'm') {
			if (line[4] == '1') {
				graph = filtered_directed_graph_t(vertex_filtration, params.directed);
				current_dimension = 1;
				has_edge_filtration = HAS_EDGE_FILTRATION::MAYBE;
			}
			continue;
		}

		if (current_dimension == 0) {
			if (vertex_filtration.empty()) vertex_filtration = split<value_t>(line, ' ', string_to_float);
		} else {
			if (has_edge_filtration == HAS_EDGE_FILTRATION::MAYBE) {
				// If the edge has three components, then there are also filtration values, which we assume to come last
				int number_of_spaces = 0;
				for (auto& iter : line)
					if (iter == ' ') { number_of_spaces++; }
				has_edge_filtration = number_of_spaces == 1 ? HAS_EDGE_FILTRATION::NO : HAS_EDGE_FILTRATION::YES;
			}

			if (has_edge_filtration == NO) {
				std::vector<vertex_index_t> vertices = split<vertex_index_t>(line, ' ', string_to_uint);
				graph.add_edge(vertices[0], vertices[1]);
			} else {
				std::vector<value_t> vertices = split<value_t>(line, ' ', string_to_float);
				if (value_t(vertices[2]) <
				    std::max(vertex_filtration[size_t(vertices[0])], vertex_filtration[size_t(vertices[1])])) {
					std::string err_msg =
					    "The flagser file contained an edge filtration that contradicts the vertex "
					    "filtration, the edge (" +
					    std::to_string(vertices[0]) + ", " + std::to_string(vertices[1]) + ") has filtration value " +
					    std::to_string(vertices[2]) + ", which is lower than min(" +
					    std::to_string(vertex_filtration[size_t(vertices[0])]) + ", " +
					    std::to_string(vertex_filtration[size_t(vertices[1])]) + "), the filtrations of its vertices.";
					throw std::runtime_error(err_msg);
				}
				graph.add_filtered_edge((vertex_index_t)vertices[0], (vertex_index_t)vertices[1], vertices[2]);
			}
		}
	}

	return graph;
}